

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O1

WaitResult<bool>
Wait<bool,EnsureNoUserDataCallable>
          (long timeout,long sleep_timeout,EnsureNoUserDataCallable *callable)

{
  byte bVar1;
  WaitResult<bool> WVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  
  lVar3 = udpdiscovery::impl::NowTime();
  do {
    WVar2 = EnsureNoUserDataCallable::operator()(callable);
    bVar5 = WVar2.has_result;
    if (((uint3)WVar2 >> 8 & 1) != 0) {
      bVar1 = WVar2.is_timeout;
      goto LAB_00107724;
    }
    udpdiscovery::impl::SleepFor(sleep_timeout);
    lVar4 = udpdiscovery::impl::NowTime();
  } while (lVar4 - lVar3 <= timeout);
  bVar1 = 1;
  bVar5 = 0;
LAB_00107724:
  return (WaitResult<bool>)((uint3)bVar1 | (uint3)bVar5 << 8 | (uint3)WVar2 & 0xff0000);
}

Assistant:

WaitResult<ResultType> Wait(long timeout, long sleep_timeout,
                            Callable callable) {
  long start_time = udpdiscovery::impl::NowTime();
  while (true) {
    WaitResult<ResultType> result = callable();
    if (result.has_result) {
      return result;
    }

    udpdiscovery::impl::SleepFor(sleep_timeout);

    long cur_time = udpdiscovery::impl::NowTime();
    if ((cur_time - start_time) > timeout) {
      break;
    }
  }

  WaitResult<ResultType> result;
  result.is_timeout = true;

  return result;
}